

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_index(jit_State *J,TRef tr)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 *puVar3;
  uint in_ESI;
  long in_RDI;
  IRIns *ir;
  undefined4 in_stack_ffffffffffffffc8;
  TRef local_24;
  
  if ((in_ESI & 0x1f000000) == 0xe000000) {
    *(undefined2 *)(in_RDI + 0xa4) = 0x5993;
    *(short *)(in_RDI + 0xa0) = (short)in_ESI;
    *(undefined2 *)(in_RDI + 0xa2) = 0x226e;
    local_24 = lj_opt_fold((jit_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8));
  }
  else {
    puVar3 = (undefined2 *)(*(long *)(in_RDI + 0x10) + (ulong)(in_ESI & 0xffff) * 8);
    local_24 = in_ESI;
    if ((((*(char *)((long)puVar3 + 5) == '5') || (*(char *)((long)puVar3 + 5) == '6')) &&
        ((ushort)puVar3[1] < 0x8000)) &&
       (*(int *)(*(long *)(in_RDI + 0x10) + (ulong)(ushort)puVar3[1] * 8) + 0x40000000U < 0x80000000
       )) {
      uVar1 = *puVar3;
      uVar2 = puVar3[1];
      *(ushort *)(in_RDI + 0xa4) = (*(byte *)((long)puVar3 + 5) - 0xc) * 0x100 | 0x13;
      *(undefined2 *)(in_RDI + 0xa0) = uVar1;
      *(undefined2 *)(in_RDI + 0xa2) = uVar2;
      local_24 = lj_opt_fold((jit_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8));
    }
  }
  return local_24;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_index(jit_State *J, TRef tr)
{
  IRIns *ir;
  lj_assertJ(tref_isnumber(tr), "expected number type");
  if (tref_isnum(tr))  /* Conversion may be narrowed, too. See above. */
    return emitir(IRTGI(IR_CONV), tr, IRCONV_INT_NUM|IRCONV_INDEX);
  /* Omit some overflow checks for array indexing. See comments above. */
  ir = IR(tref_ref(tr));
  if ((ir->o == IR_ADDOV || ir->o == IR_SUBOV) && irref_isk(ir->op2) &&
      (uint32_t)IR(ir->op2)->i + 0x40000000u < 0x80000000u)
    return emitir(IRTI(ir->o - IR_ADDOV + IR_ADD), ir->op1, ir->op2);
  return tr;
}